

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsectoreffect.cpp
# Opt level: O2

bool __thiscall
sector_t::MoveAttached(sector_t *this,int crush,double move,int floorOrCeiling,bool resetfailed)

{
  bool bVar1;
  
  bVar1 = P_Scroll3dMidtex((sector_t_conflict *)this,crush,move,floorOrCeiling != 0);
  if (bVar1 || !resetfailed) {
    bVar1 = P_MoveLinkedSectors((sector_t_conflict *)this,crush,move,floorOrCeiling != 0);
    if (bVar1 || !resetfailed) {
      return true;
    }
    P_MoveLinkedSectors((sector_t_conflict *)this,crush,-move,floorOrCeiling != 0);
  }
  P_Scroll3dMidtex((sector_t_conflict *)this,crush,-move,floorOrCeiling != 0);
  return false;
}

Assistant:

bool sector_t::MoveAttached(int crush, double move, int floorOrCeiling, bool resetfailed)
{
	if (!P_Scroll3dMidtex(this, crush, move, !!floorOrCeiling) && resetfailed)
	{
		P_Scroll3dMidtex(this, crush, -move, !!floorOrCeiling);
		return false;
	}
	if (!P_MoveLinkedSectors(this, crush, move, !!floorOrCeiling) && resetfailed)
	{
		P_MoveLinkedSectors(this, crush, -move, !!floorOrCeiling);
		P_Scroll3dMidtex(this, crush, -move, !!floorOrCeiling);
		return false;
	}
	return true;
}